

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::TestSuite::TestSuite
          (TestSuite *this,char *a_name,char *a_type_param,SetUpTestSuiteFunc set_up_tc,
          TearDownTestSuiteFunc tear_down_tc)

{
  allocator<char> *__a;
  undefined8 in_RCX;
  long in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_type in_R8;
  pointer in_stack_ffffffffffffff58;
  unique_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff60;
  TestResult *this_00;
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  size_type *__s;
  allocator<char> local_4a;
  undefined1 local_49;
  allocator<char> *local_48;
  allocator<char> local_29;
  size_type local_28;
  undefined8 local_20;
  long local_18;
  
  *(undefined ***)in_RDI = &PTR__TestSuite_00189c28;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RDI,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::allocator<char>::~allocator(&local_29);
  __s = &in_RDI[1]._M_string_length;
  local_49 = 0;
  if (local_18 != 0) {
    __a = (allocator<char> *)operator_new(0x20);
    local_49 = 1;
    local_48 = __a;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_RDI,(char *)__s,__a);
  }
  local_49 = 0;
  std::unique_ptr<std::__cxx11::string_const,std::default_delete<std::__cxx11::string_const>>::
  unique_ptr<std::default_delete<std::__cxx11::string_const>,void>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (local_18 != 0) {
    std::allocator<char>::~allocator(&local_4a);
  }
  std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::vector
            ((vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *)0x121666);
  this_00 = (TestResult *)&in_RDI[2]._M_string_length;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x121679);
  *(undefined8 *)(in_RDI + 3) = local_20;
  in_RDI[3]._M_string_length = local_28;
  in_RDI[3].field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&in_RDI[3].field_2 + 8) = 0;
  *(undefined8 *)(in_RDI + 4) = 0;
  TestResult::TestResult(this_00);
  return;
}

Assistant:

TestSuite::TestSuite(const char* a_name, const char* a_type_param,
                     internal::SetUpTestSuiteFunc set_up_tc,
                     internal::TearDownTestSuiteFunc tear_down_tc)
    : name_(a_name),
      type_param_(a_type_param ? new std::string(a_type_param) : nullptr),
      set_up_tc_(set_up_tc),
      tear_down_tc_(tear_down_tc),
      should_run_(false),
      start_timestamp_(0),
      elapsed_time_(0) {}